

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

bool __thiscall
srell::regex_internal::groupname_and_backrefnumber_mapper<char,_unsigned_int>::push_back
          (groupname_and_backrefnumber_mapper<char,_unsigned_int> *this,gname_string *gname,
          uint class_number)

{
  size_type sVar1;
  bool bVar2;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint num;
  uint class_number_local;
  gname_string *gname_local;
  groupname_and_backrefnumber_mapper<char,_unsigned_int> *this_local;
  
  local_24 = class_number;
  _num = gname;
  gname_local = &this->names_;
  local_28 = operator[](this,gname);
  bVar2 = local_28 == 0xffffffff;
  if (bVar2) {
    simple_array<char>::append(&this->names_,_num);
    sVar1 = simple_array<char>::size(_num);
    local_2c = (uint)sVar1;
    simple_array<unsigned_int>::append(&this->keysize_classno_,1,&local_2c);
    simple_array<unsigned_int>::append(&this->keysize_classno_,1,&local_24);
  }
  return bVar2;
}

Assistant:

bool push_back(const gname_string &gname, const numberT class_number)
	{
		const numberT num = operator[](gname);

		if (num == notfound)
		{
			names_.append(gname);
			keysize_classno_.append(1, static_cast<numberT>(gname.size()));
			keysize_classno_.append(1, class_number);
			return true;
		}
		return false;	//  Already exists.
	}